

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XmlWriter *pXVar2;
  pointer pMVar3;
  pointer pcVar4;
  XmlReporter *this_01;
  int iVar5;
  OfType OVar6;
  undefined8 in_RCX;
  XmlFormatting fmt;
  pointer pMVar7;
  _Alloc_hider _Var8;
  char cVar9;
  string local_b8;
  undefined4 local_94;
  undefined1 local_90 [32];
  string local_70;
  _Alloc_hider local_50;
  XmlReporter *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar5 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_94 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (((char)iVar5 == '\0') &&
     ((OVar6 = (assertionStats->assertionResult).m_resultData.resultType, (OVar6 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar6 != Warning) {
      return true;
    }
    local_94 = 0;
  }
  pMVar7 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  fmt = (XmlFormatting)&local_b8;
  local_50._M_p = (pointer)assertionStats;
  local_48 = this;
  if (pMVar7 != pMVar3) {
    cVar9 = (char)local_94;
    do {
      if (pMVar7->type == Info && cVar9 == '\x01') {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Info","");
        XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,fmt);
        XmlWriter::writeText((XmlWriter *)local_90._0_8_,&pMVar7->message,Newline|Indent);
LAB_0014841b:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      else if (pMVar7->type == Warning) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Warning","");
        XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,fmt);
        XmlWriter::writeText((XmlWriter *)local_90._0_8_,&pMVar7->message,Newline|Indent);
        goto LAB_0014841b;
      }
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != pMVar3);
  }
  this_01 = local_48;
  _Var8._M_p = local_50._M_p;
  OVar6 = *(OfType *)(local_50._M_p + 0x90);
  if ((byte)((byte)local_94 | OVar6 == Warning) != 1) {
    return true;
  }
  if (*(size_type *)(local_50._M_p + 0x30) != 0) {
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expression","");
    this_00 = &this_01->m_xml;
    XmlWriter::startElement(this_00,&local_b8,Newline|Indent);
    pXVar2 = (XmlWriter *)(local_90 + 0x10);
    local_90._0_8_ = pXVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"success","");
    XmlWriter::writeAttribute
              (this_00,(string *)local_90,(*(OfType *)(_Var8._M_p + 0x90) & FailureBit) == Ok);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"type","");
    local_40._M_allocated_capacity =
         (size_type)(((AssertionResult *)(local_50._M_p + 8))->m_info).macroName.m_start;
    local_40._8_8_ = *(undefined8 *)(local_50._M_p + 0x10);
    XmlWriter::writeAttribute<Catch::StringRef>(this_00,&local_70,(StringRef *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    _Var8._M_p = local_50._M_p;
    if ((XmlWriter *)local_90._0_8_ != pXVar2) {
      operator_delete((void *)local_90._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p = ((SourceLineInfo *)(_Var8._M_p + 0x18))->file;
    local_b8._M_string_length = *(size_type *)(_Var8._M_p + 0x20);
    writeSourceInfo(this_01,(SourceLineInfo *)&local_b8);
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Original","");
    XmlWriter::scopedElement((XmlWriter *)&local_70,(string *)this_00,fmt);
    AssertionResult::getExpression_abi_cxx11_
              ((string *)local_90,(AssertionResult *)(_Var8._M_p + 8));
    XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,(string *)local_90,Newline|Indent);
    if ((XmlWriter *)local_90._0_8_ != pXVar2) {
      operator_delete((void *)local_90._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expanded","");
    XmlWriter::scopedElement((XmlWriter *)&local_70,(string *)this_00,fmt);
    AssertionResult::getExpandedExpression_abi_cxx11_
              ((string *)local_90,(AssertionResult *)(_Var8._M_p + 8));
    XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,(string *)local_90,Newline|Indent);
    if ((XmlWriter *)local_90._0_8_ != pXVar2) {
      operator_delete((void *)local_90._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    OVar6 = *(OfType *)(_Var8._M_p + 0x90);
  }
  if (OVar6 < ThrewException) {
    if (OVar6 == Info) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Info","");
      XmlWriter::scopedElement((XmlWriter *)&local_70,(string *)&this_01->m_xml,fmt);
      pcVar4 = (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message._M_dataplus.
               _M_p;
      local_90._0_8_ = (XmlWriter *)(local_90 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar4,
                 pcVar4 + (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message.
                          _M_string_length);
      XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,(string *)local_90,Newline|Indent)
      ;
      if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      goto LAB_001488e1;
    }
    if (OVar6 != ExplicitFailure) goto LAB_001488e1;
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Failure","");
    XmlWriter::startElement(&this_01->m_xml,&local_b8,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p =
         (((AssertionStats *)_Var8._M_p)->assertionResult).m_info.lineInfo.file;
    local_b8._M_string_length =
         (((AssertionStats *)_Var8._M_p)->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_01,(SourceLineInfo *)&local_b8);
    pcVar4 = (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message._M_dataplus._M_p
    ;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar4,
               pcVar4 + (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message.
                        _M_string_length);
    XmlWriter::writeText(&this_01->m_xml,&local_b8,Newline|Indent);
  }
  else if (OVar6 == FatalErrorCondition) {
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"FatalErrorCondition","");
    XmlWriter::startElement(&this_01->m_xml,&local_b8,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p =
         (((AssertionStats *)_Var8._M_p)->assertionResult).m_info.lineInfo.file;
    local_b8._M_string_length =
         (((AssertionStats *)_Var8._M_p)->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_01,(SourceLineInfo *)&local_b8);
    pcVar4 = (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message._M_dataplus._M_p
    ;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar4,
               pcVar4 + (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message.
                        _M_string_length);
    XmlWriter::writeText(&this_01->m_xml,&local_b8,Newline|Indent);
  }
  else {
    if (OVar6 != ThrewException) goto LAB_001488e1;
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Exception","");
    XmlWriter::startElement(&this_01->m_xml,&local_b8,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p =
         (((AssertionStats *)_Var8._M_p)->assertionResult).m_info.lineInfo.file;
    local_b8._M_string_length =
         (((AssertionStats *)_Var8._M_p)->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_01,(SourceLineInfo *)&local_b8);
    pcVar4 = (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message._M_dataplus._M_p
    ;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar4,
               pcVar4 + (((AssertionStats *)_Var8._M_p)->assertionResult).m_resultData.message.
                        _M_string_length);
    XmlWriter::writeText(&this_01->m_xml,&local_b8,Newline|Indent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  XmlWriter::endElement(&this_01->m_xml,Newline|Indent);
LAB_001488e1:
  if ((((AssertionStats *)_Var8._M_p)->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement(&this_01->m_xml,Newline|Indent);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }